

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_11f98de::AV1FrameSizeTests::~AV1FrameSizeTests(AV1FrameSizeTests *this)

{
  libaom_test::EncoderTest::~EncoderTest(&this->super_EncoderTest);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~AV1FrameSizeTests() override = default;